

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Maybe<capnp::InterfaceSchema> __thiscall
capnp::InterfaceSchema::findSuperclass(InterfaceSchema *this,uint64_t typeId,uint *counter)

{
  RawBrandedSchema *pRVar1;
  uint *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_00;
  ulong uVar3;
  uint64_t id;
  ulong uVar4;
  Maybe<capnp::InterfaceSchema> MVar5;
  Schema local_d8;
  Schema local_d0;
  Reader superclasses;
  Fault f;
  Reader local_60;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 aVar2;
  
  superclasses.reader.segment._0_4_ = *in_RCX;
  *in_RCX = (uint)superclasses.reader.segment + 1;
  superclasses.reader.capTable = (CapTableReader *)&MAX_SUPERCLASSES;
  superclasses.reader.ptr = " < ";
  superclasses.reader.elementCount = 4;
  superclasses.reader.step = 0;
  superclasses.reader.structDataSize._0_1_ = (uint)superclasses.reader.segment < 0x40;
  if ((bool)(undefined1)superclasses.reader.structDataSize) {
    pRVar1 = *(RawBrandedSchema **)typeId;
    aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2)counter;
    if ((uint *)(*(RawBrandedSchema **)typeId)->generic->id == counter) {
LAB_002fba37:
      *(undefined1 *)&(this->super_Schema).raw = 1;
      this[1].super_Schema.raw = pRVar1;
    }
    else {
      Schema::getProto(&local_60,(Schema *)typeId);
      capnp::schema::Node::Interface::Reader::getSuperclasses(&superclasses,(Reader *)&f);
      uVar3 = superclasses.reader._24_8_ & 0xffffffff;
      aVar2 = extraout_RDX;
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        capnp::_::ListReader::getStructElement
                  ((StructReader *)&f,&superclasses.reader,(ElementCount)uVar4);
        if (local_60._reader.dataSize < 0x40) {
          id = 0;
        }
        else {
          id = *local_60._reader.data;
        }
        local_d8 = Schema::getDependency((Schema *)typeId,id,(ElementCount)uVar4 | 0x4000000);
        local_d0.raw = (RawBrandedSchema *)Schema::asInterface(&local_d8);
        MVar5 = findSuperclass((InterfaceSchema *)&local_60,(uint64_t)&local_d0,counter);
        aVar2 = MVar5.ptr.field_1;
        pRVar1 = (RawBrandedSchema *)local_60._reader.capTable;
        if ((char)local_60._reader.segment == '\x01') goto LAB_002fba37;
      }
      *(undefined1 *)&(this->super_Schema).raw = 0;
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x2a0,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",
               (DebugComparison<unsigned_int,_const_unsigned_int_&> *)&superclasses,
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    *(undefined1 *)&(this->super_Schema).raw = 0;
    kj::_::Debug::Fault::~Fault(&f);
    aVar2 = extraout_RDX_00;
  }
  MVar5.ptr.field_1.field1 = aVar2.field1;
  MVar5.ptr._0_8_ = this;
  return (Maybe<capnp::InterfaceSchema>)MVar5.ptr;
}

Assistant:

kj::Maybe<InterfaceSchema> InterfaceSchema::findSuperclass(uint64_t typeId, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return kj::none;
  }

  if (typeId == raw->generic->id) {
    return *this;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    KJ_IF_SOME(result, getDependency(superclass.getId(), location).asInterface()
                            .findSuperclass(typeId, counter)) {
      return result;
    }
  }

  return kj::none;
}